

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  ArrayIndex AVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_bool> pVar3;
  OStringStream oss;
  String SStack_1b8;
  ValueHolder local_198;
  undefined2 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  
  if (*(char *)&this->bits_ == '\0') {
    local_190 = 6;
    local_188 = 0;
    uStack_180 = 0;
    local_178 = 0;
    local_198.string_ = (char *)operator_new(0x30);
    p_Var1 = &((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    *(char *)((long)local_198 + 0) = '\0';
    *(char *)((long)local_198 + 1) = '\0';
    *(char *)((long)local_198 + 2) = '\0';
    *(char *)((long)local_198 + 3) = '\0';
    *(char *)((long)local_198 + 4) = '\0';
    *(char *)((long)local_198 + 5) = '\0';
    *(char *)((long)local_198 + 6) = '\0';
    *(char *)((long)local_198 + 7) = '\0';
    *(undefined8 *)&((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    ((local_198.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    swap((Value *)&local_198,this);
    ~Value((Value *)&local_198);
  }
  else if (*(char *)&this->bits_ != '\x06') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198.bool_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"in Json::Value::append: requires arrayValue",0x2b);
    std::__cxx11::stringbuf::str();
    throwLogicError(&SStack_1b8);
  }
  this_00 = (_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
             *)(this->value_).map_;
  AVar2 = size(this);
  local_198.uint_._0_4_ = AVar2;
  pVar3 = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_unique<unsigned_int,Json::Value>(this_00,(uint *)&local_198.uint_,value);
  return (Value *)&pVar3.first._M_node._M_node[1]._M_left;
}

Assistant:

Value& Value::append(Value&& value) {
  JSON_ASSERT_MESSAGE(type() == nullValue || type() == arrayValue,
                      "in Json::Value::append: requires arrayValue");
  if (type() == nullValue) {
    *this = Value(arrayValue);
  }
  return this->value_.map_->emplace(size(), std::move(value)).first->second;
}